

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

Script * __thiscall
cfd::core::AbstractTransaction::SetUnlockingScript
          (Script *__return_storage_ptr__,AbstractTransaction *this,uint32_t tx_in_index,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_script)

{
  pointer pBVar1;
  pointer __x;
  ScriptBuilder builder;
  ByteData script;
  ScriptBuilder local_88;
  Script local_68;
  
  (*this->_vptr_AbstractTransaction[0xb])(this,(ulong)tx_in_index,0x1a6,"SetUnlockingScript");
  local_88._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
  local_88.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar1 = (unlocking_script->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (unlocking_script->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_start; __x != pBVar1; __x = __x + 1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,&__x->data_);
    ScriptBuilder::AppendData(&local_88,(ByteData *)&local_68);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  }
  ScriptBuilder::Build(&local_68,&local_88);
  SetUnlockingScript(this,tx_in_index,&local_68);
  Script::~Script(&local_68);
  ScriptBuilder::Build(__return_storage_ptr__,&local_88);
  ScriptBuilder::~ScriptBuilder(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Script AbstractTransaction::SetUnlockingScript(
    uint32_t tx_in_index, const std::vector<ByteData> &unlocking_script) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  ScriptBuilder builder;
  for (ByteData script : unlocking_script) {
    builder.AppendData(script);
  }
  SetUnlockingScript(tx_in_index, builder.Build());
  return builder.Build();
}